

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O1

Vec_Int_t * Ioa_WriteAigerLiterals(Aig_Man_t *pMan)

{
  int iVar1;
  ulong uVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  iVar1 = pMan->nObjs[3];
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar3;
  uVar7 = iVar1 - pMan->nRegs;
  pVVar4 = pMan->vCos;
  if ((int)uVar7 < pVVar4->nSize) {
    uVar6 = (ulong)uVar7;
    do {
      if ((int)uVar7 < 0) goto LAB_007df61e;
      uVar2 = *(ulong *)((long)pVVar4->pArray[uVar6] + 8);
      iVar1 = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x28);
      Vec_IntPush(p,((uint)(iVar1 == 0) ^ (uint)uVar2 & 1) + iVar1 * 2);
      uVar6 = uVar6 + 1;
      pVVar4 = pMan->vCos;
    } while ((int)uVar6 < pVVar4->nSize);
  }
  if (pMan->nRegs < pMan->nObjs[3]) {
    lVar8 = 0;
    do {
      if (pMan->vCos->nSize <= lVar8) {
LAB_007df61e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar6 = *(ulong *)((long)pMan->vCos->pArray[lVar8] + 8);
      iVar1 = *(int *)((uVar6 & 0xfffffffffffffffe) + 0x28);
      Vec_IntPush(p,((uint)(iVar1 == 0) ^ (uint)uVar6 & 1) + iVar1 * 2);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (long)pMan->nObjs[3] - (long)pMan->nRegs);
  }
  return p;
}

Assistant:

Vec_Int_t * Ioa_WriteAigerLiterals( Aig_Man_t * pMan )
{
    Vec_Int_t * vLits;
    Aig_Obj_t * pObj, * pDriver;
    int i;
    vLits = Vec_IntAlloc( Aig_ManCoNum(pMan) );
    Aig_ManForEachLiSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    return vLits;
}